

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O0

bool test_Player_fortify(bool verbose)

{
  int iVar1;
  GameLoop *pGVar2;
  vector<Player_*,_std::allocator<Player_*>_> *pvVar3;
  reference ppPVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar5;
  reference ppCVar6;
  Country *this;
  ostream *poVar7;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  value_type local_60;
  Country *c1;
  undefined1 local_4d;
  int numArmiesC2;
  allocator<char> local_39;
  string local_38;
  Country *local_18;
  Country *neighbour;
  int numArmiesC1;
  bool success;
  bool verbose_local;
  
  neighbour._6_1_ = 1;
  neighbour._7_1_ = verbose;
  GameLoop::start();
  pGVar2 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar2);
  pGVar2 = GameLoop::getInstance();
  pvVar3 = GameLoop::getAllPlayers(pGVar2);
  ppPVar4 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar3,0);
  pvVar5 = Player::getOwnedCountries(*ppPVar4);
  ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar5,0);
  neighbour._0_4_ = Map::Country::getNumberOfTroops(*ppCVar6);
  this = (Country *)operator_new(0x30);
  local_4d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"neighbour",&local_39);
  Map::Country::Country(this,99,&local_38,1);
  local_4d = 0;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = this;
  pGVar2 = GameLoop::getInstance();
  pvVar3 = GameLoop::getAllPlayers(pGVar2);
  ppPVar4 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar3,0);
  iVar1 = Player::getPlayerId(*ppPVar4);
  Map::Country::setPlayerOwnerID(this,iVar1);
  c1._4_4_ = Map::Country::getNumberOfTroops(local_18);
  pGVar2 = GameLoop::getInstance();
  pvVar3 = GameLoop::getAllPlayers(pGVar2);
  ppPVar4 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar3,0);
  pvVar5 = Player::getOwnedCountries(*ppPVar4);
  ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar5,0);
  pvVar5 = Map::Country::getAdjCountries(*ppCVar6);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(pvVar5,&local_18);
  pGVar2 = GameLoop::getInstance();
  pvVar3 = GameLoop::getAllPlayers(pGVar2);
  ppPVar4 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar3,0);
  iVar1 = Player::fortify(*ppPVar4);
  if (iVar1 == -1) {
    neighbour._6_1_ = 0;
  }
  if ((neighbour._7_1_ & 1) != 0) {
    pGVar2 = GameLoop::getInstance();
    pvVar3 = GameLoop::getAllPlayers(pGVar2);
    ppPVar4 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar3,0);
    pvVar5 = Player::getOwnedCountries(*ppPVar4);
    ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar5,0);
    local_60 = *ppCVar6;
    std::operator<<((ostream *)&std::cout,"\x1b[35m");
    poVar7 = std::operator<<((ostream *)&std::cout,"Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_80,local_60);
    poVar7 = std::operator<<(poVar7,(string *)&local_80);
    poVar7 = std::operator<<(poVar7," had ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)neighbour);
    poVar7 = std::operator<<(poVar7," armies");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_80);
    poVar7 = std::operator<<((ostream *)&std::cout,"Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_a0,local_60);
    poVar7 = std::operator<<(poVar7,(string *)&local_a0);
    poVar7 = std::operator<<(poVar7," now has ");
    iVar1 = Map::Country::getNumberOfTroops(local_60);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar1);
    poVar7 = std::operator<<(poVar7," armies");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_a0);
    poVar7 = std::operator<<((ostream *)&std::cout,"Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_c0,local_18);
    poVar7 = std::operator<<(poVar7,(string *)&local_c0);
    poVar7 = std::operator<<(poVar7," had ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,c1._4_4_);
    poVar7 = std::operator<<(poVar7," armies");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_c0);
    poVar7 = std::operator<<((ostream *)&std::cout,"Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_e0,local_18);
    poVar7 = std::operator<<(poVar7,(string *)&local_e0);
    poVar7 = std::operator<<(poVar7," now has ");
    iVar1 = Map::Country::getNumberOfTroops(local_18);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar1);
    poVar7 = std::operator<<(poVar7," armies");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_e0);
    std::operator<<((ostream *)&std::cout,"\x1b[31m");
  }
  GameLoop::resetInstance();
  return (bool)(neighbour._6_1_ & 1);
}

Assistant:

bool test_Player_fortify(bool verbose = false) {

    bool success = true;
    GameLoop::start();
    GameLoop::getInstance()->distributeArmies(); // because you need armies to fortify

    int numArmiesC1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getNumberOfTroops();
    auto* neighbour = new Map::Country(99, "neighbour", 1);
    neighbour->setPlayerOwnerID(GameLoop::getInstance()->getAllPlayers()->at(0)->getPlayerId());
    int numArmiesC2 = neighbour->getNumberOfTroops();

    GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getAdjCountries()->push_back(neighbour);

    if (GameLoop::getInstance()->getAllPlayers()->at(0)->fortify() == PlayerAction::FAILED) {
        success = false;
    }

    if (verbose) {
        Map::Country* c1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0);
        std::cout << "\033[35m";
        std::cout << "Country " << c1->getCountryName() << " had " << numArmiesC1 << " armies" << std::endl;
        std::cout << "Country " << c1->getCountryName() << " now has " << c1->getNumberOfTroops() << " armies"
                  << std::endl;
        std::cout << "Country " << neighbour->getCountryName() << " had " << numArmiesC2 <<" armies" << std::endl;
        std::cout << "Country " << neighbour->getCountryName() << " now has " << neighbour->getNumberOfTroops() << " armies"
                  << std::endl;
        std::cout << "\033[31m";
    }
    GameLoop::resetInstance();
    return success;
}